

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
          (BasicProblem<mp::BasicProblemParams<int>_> *this,size_t nvars,double lb,double ub,
          Type type)

{
  char *pcVar1;
  reference pvVar2;
  uint in_ECX;
  ulong in_RDX;
  size_type in_RSI;
  allocator_type *in_RDI;
  Variable VVar3;
  size_t i;
  vector<int,_std::allocator<int>_> *newVars;
  allocator_type *this_00;
  undefined1 *ub_00;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_58;
  ulong local_48;
  undefined1 local_2e;
  undefined1 local_2d;
  uint local_2c;
  ulong local_18;
  
  local_2d = 0;
  ub_00 = &local_2e;
  this_00 = in_RDI;
  local_2c = in_ECX;
  local_18 = in_RDX;
  std::allocator<int>::allocator((allocator<int> *)0x4bfc10);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,in_RSI,in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x4bfc30);
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    pcVar1 = (char *)(ulong)local_2c;
    VVar3 = AddVar((BasicProblem<mp::BasicProblemParams<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (double)in_stack_ffffffffffffff98,(double)ub_00,(Type)(in_RDX >> 0x20));
    in_stack_ffffffffffffff98 =
         VVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
         problem_;
    in_stack_ffffffffffffffa0 =
         VVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    local_58.problem_ = in_stack_ffffffffffffff98;
    local_58.index_ = in_stack_ffffffffffffffa0;
    pcVar1 = BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>::index
                       (&local_58,pcVar1,in_stack_ffffffffffffffa0);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_00,local_48);
    *pvVar2 = (value_type)pcVar1;
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> AddVars(std::size_t nvars,
                           double lb=-INFINITY, double ub=INFINITY,
                           var::Type type = var::CONTINUOUS) {
    std::vector<int> newVars(nvars);
    for (std::size_t  i=0; i<nvars; ++i)
      newVars[i] = AddVar(lb, ub, type).index();
    return newVars;
  }